

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void __thiscall ncnn::UnlockedPoolAllocator::UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  UnlockedPoolAllocatorPrivate *pUVar1;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_0064d4e8;
  pUVar1 = (UnlockedPoolAllocatorPrivate *)operator_new(0x40);
  (pUVar1->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pUVar1->budgets;
  (pUVar1->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pUVar1->budgets;
  (pUVar1->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (pUVar1->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pUVar1->payouts;
  (pUVar1->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pUVar1->payouts;
  (pUVar1->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node._M_size = 0;
  this->d = pUVar1;
  pUVar1->size_compare_ratio = 0;
  pUVar1->size_drop_threshold = 10;
  return;
}

Assistant:

UnlockedPoolAllocator::UnlockedPoolAllocator()
    : Allocator(), d(new UnlockedPoolAllocatorPrivate)
{
    d->size_compare_ratio = 0;
    d->size_drop_threshold = 10;
}